

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  bool bVar4;
  char *pcVar5;
  Value *pVVar6;
  _Elt_pointer ppVVar7;
  long *plVar8;
  _Elt_pointer ppVVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Elt_pointer ppVVar11;
  ValueHolder VVar12;
  string name;
  Token comma;
  Token tokenName;
  Token colon;
  ValueHolder local_c0;
  ulong local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Token local_60;
  Token local_48;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  pcVar5 = (char *)operator_new(0x30);
  pcVar5[0x10] = '\0';
  pcVar5[0x11] = '\0';
  pcVar5[0x12] = '\0';
  pcVar5[0x13] = '\0';
  pcVar5[0x14] = '\0';
  pcVar5[0x15] = '\0';
  pcVar5[0x16] = '\0';
  pcVar5[0x17] = '\0';
  pcVar5[0x18] = '\0';
  pcVar5[0x19] = '\0';
  pcVar5[0x1a] = '\0';
  pcVar5[0x1b] = '\0';
  pcVar5[0x1c] = '\0';
  pcVar5[0x1d] = '\0';
  pcVar5[0x1e] = '\0';
  pcVar5[0x1f] = '\0';
  pcVar5[0] = '\0';
  pcVar5[1] = '\0';
  pcVar5[2] = '\0';
  pcVar5[3] = '\0';
  pcVar5[4] = '\0';
  pcVar5[5] = '\0';
  pcVar5[6] = '\0';
  pcVar5[7] = '\0';
  pcVar5[8] = '\0';
  pcVar5[9] = '\0';
  pcVar5[10] = '\0';
  pcVar5[0xb] = '\0';
  pcVar5[0xc] = '\0';
  pcVar5[0xd] = '\0';
  pcVar5[0xe] = '\0';
  pcVar5[0xf] = '\0';
  *(char **)(pcVar5 + 0x18) = pcVar5 + 8;
  *(char **)(pcVar5 + 0x20) = pcVar5 + 8;
  pcVar5[0x28] = '\0';
  pcVar5[0x29] = '\0';
  pcVar5[0x2a] = '\0';
  pcVar5[0x2b] = '\0';
  pcVar5[0x2c] = '\0';
  pcVar5[0x2d] = '\0';
  pcVar5[0x2e] = '\0';
  pcVar5[0x2f] = '\0';
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar6 = ppVVar7[-1];
  local_c0.map_ = *(ObjectValues **)&pVVar6->value_;
  (pVVar6->value_).string_ = pcVar5;
  uVar2 = *(ushort *)&pVVar6->field_0x8;
  *(ushort *)&pVVar6->field_0x8 = uVar2 & 0xfe00 | 7;
  local_b8 = CONCAT62(local_b8._2_6_,uVar2) & 0xffffffffffff01ff;
  Value::~Value((Value *)&local_c0);
  do {
    readToken(this,&local_60);
    while (local_60.type_ == tokenComment) {
      readToken(this,&local_60);
    }
    if (local_60.type_ == tokenObjectEnd) {
      if ((char *)local_a0._M_string_length != (char *)0x0) {
LAB_001c42b3:
        local_c0.string_ = (char *)&local_b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Missing \'}\' or object member name","");
        addError(this,(string *)&local_c0,&local_60,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
LAB_001c42f5:
        local_80.field_2._M_allocated_capacity = local_b0._M_allocated_capacity;
        VVar12 = local_c0;
        if (local_c0 != &local_b0) {
LAB_001c4304:
          operator_delete(VVar12.string_,local_80.field_2._M_allocated_capacity + 1);
        }
LAB_001c430c:
        bVar4 = false;
        goto LAB_001c4312;
      }
      break;
    }
    if (local_60.type_ != tokenString) goto LAB_001c42b3;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x275519);
    bVar4 = decodeString(this,&local_60,&local_a0);
    if (!bVar4) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_001c430c;
    }
    readToken(this,&local_48);
    if (local_48.type_ != tokenMemberSeparator) {
      local_c0.string_ = (char *)&local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Missing \':\' after object member name","");
      addError(this,(string *)&local_c0,&local_48,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_001c42f5;
    }
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar11 = ppVVar7;
    if (ppVVar7 == ppVVar9) {
      ppVVar11 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (ppVVar11[-1]->field_0x8 == '\a') {
      pVVar6 = Value::operator[](ppVVar11[-1],local_a0._M_dataplus._M_p);
      if (pVVar6 == (Value *)Value::null) {
        ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first;
        goto LAB_001c41f9;
      }
      std::operator+(&local_80,"Key \'",&local_a0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar10) {
        local_b0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_b0._8_8_ = plVar8[3];
        local_c0.string_ = (char *)&local_b0;
      }
      else {
        local_b0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_c0.string_ = (char *)*plVar8;
      }
      local_b8 = plVar8[1];
      *plVar8 = (long)paVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      addError(this,(string *)&local_c0,&local_60,(Location)0x0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0.string_,local_b0._M_allocated_capacity + 1);
      }
      VVar12._4_4_ = local_80._M_dataplus._M_p._4_4_;
      VVar12.int_ = (uint)local_80._M_dataplus._M_p;
      if (VVar12 == &local_80.field_2) goto LAB_001c430c;
      goto LAB_001c4304;
    }
LAB_001c41f9:
    if (ppVVar7 == ppVVar9) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_c0.map_ =
         (ObjectValues *)Value::resolveReference(ppVVar7[-1],local_a0._M_dataplus._M_p,false);
    pVVar3 = (ValueHolder *)
             (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pVVar3 == (ValueHolder *)
                  ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_c0.map_);
    }
    else {
      pVVar3->map_ = (ObjectValues *)local_c0;
      piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    bVar4 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar4) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_001c430c;
    }
    readToken(this,(Token *)&local_80);
    if ((0xd < (uint)local_80._M_dataplus._M_p) ||
       ((0x2804U >> ((uint)local_80._M_dataplus._M_p & 0x1f) & 1) == 0)) {
      local_c0.string_ = (char *)&local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(string *)&local_c0,(Token *)&local_80,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_001c42f5;
    }
    while ((uint)local_80._M_dataplus._M_p == 0xd) {
      readToken(this,(Token *)&local_80);
    }
  } while ((uint)local_80._M_dataplus._M_p != 2);
  bVar4 = true;
LAB_001c4312:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool
Reader::readObject ( Token& tokenStart )
{
    Token tokenName;
    std::string name;
    currentValue () = Value ( objectValue );

    while ( readToken ( tokenName ) )
    {
        bool initialTokenOk = true;

        while ( tokenName.type_ == tokenComment  &&  initialTokenOk )
            initialTokenOk = readToken ( tokenName );

        if  ( !initialTokenOk )
            break;

        if ( tokenName.type_ == tokenObjectEnd  &&  name.empty () ) // empty object
            return true;

        if ( tokenName.type_ != tokenString )
            break;

        name = "";

        if ( !decodeString ( tokenName, name ) )
            return recoverFromError ( tokenObjectEnd );

        Token colon;

        if ( !readToken ( colon ) ||  colon.type_ != tokenMemberSeparator )
        {
            return addErrorAndRecover ( "Missing ':' after object member name",
                                        colon,
                                        tokenObjectEnd );
        }

        // Reject duplicate names
        if (currentValue ().isMember (name))
            return addError ( "Key '" + name + "' appears twice.", tokenName );

        Value& value = currentValue ()[ name ];
        nodes_.push ( &value );
        bool ok = readValue ();
        nodes_.pop ();

        if ( !ok ) // error already set
            return recoverFromError ( tokenObjectEnd );

        Token comma;

        if ( !readToken ( comma )
                ||  ( comma.type_ != tokenObjectEnd  &&
                      comma.type_ != tokenArraySeparator &&
                      comma.type_ != tokenComment ) )
        {
            return addErrorAndRecover ( "Missing ',' or '}' in object declaration",
                                        comma,
                                        tokenObjectEnd );
        }

        bool finalizeTokenOk = true;

        while ( comma.type_ == tokenComment &&
                finalizeTokenOk )
            finalizeTokenOk = readToken ( comma );

        if ( comma.type_ == tokenObjectEnd )
            return true;
    }

    return addErrorAndRecover ( "Missing '}' or object member name",
                                tokenName,
                                tokenObjectEnd );
}